

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device__cork_stream__pulse(ma_device *pDevice,ma_device_type deviceType,int cork)

{
  ma_context *pmVar1;
  long lVar2;
  ma_result mVar3;
  ma_pa_operation *pOP;
  ma_result resultCode;
  char *message;
  ma_bool32 wasSuccessful;
  
  pmVar1 = pDevice->pContext;
  wasSuccessful = 0;
  lVar2 = *(long *)((long)&pDevice->field_23 +
                   (ulong)(deviceType == ma_device_type_capture) * 8 + 0x18);
  if (lVar2 == 0) {
    __assert_fail("pStream != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4d74,
                  "ma_result ma_device__cork_stream__pulse(ma_device *, ma_device_type, int)");
  }
  resultCode = (ma_result)&wasSuccessful;
  pOP = (ma_pa_operation *)
        (*(pmVar1->field_21).alsa.snd_pcm_start)
                  (lVar2,(ulong)(uint)cork,ma_pulse_operation_complete_callback);
  if (pOP == (ma_pa_operation *)0x0) {
    mVar3 = (cork == 0) - 0x12f;
    message = "[PulseAudio] Failed to cork PulseAudio stream.";
  }
  else {
    mVar3 = ma_device__wait_for_operation__pulse(pDevice,pOP);
    (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_channels_min)(pOP);
    if (mVar3 == 0) {
      if (wasSuccessful != 0) {
        return 0;
      }
      message = "[PulseAudio] Failed to stop PulseAudio stream.";
      if (cork == 0) {
        message = "[PulseAudio] Failed to start PulseAudio stream.";
      }
      mVar3 = (cork == 0) - 0x12f;
    }
    else {
      message = "[PulseAudio] An error occurred while waiting for the PulseAudio stream to cork.";
    }
  }
  ma_post_error(pDevice,1,message,resultCode);
  return mVar3;
}

Assistant:

static ma_result ma_device__cork_stream__pulse(ma_device* pDevice, ma_device_type deviceType, int cork)
{
    ma_context* pContext = pDevice->pContext;
    ma_bool32 wasSuccessful;
    ma_pa_stream* pStream;
    ma_pa_operation* pOP;
    ma_result result;

    /* This should not be called with a duplex device type. */
    if (deviceType == ma_device_type_duplex) {
        return MA_INVALID_ARGS;
    }

    wasSuccessful = MA_FALSE;

    pStream = (ma_pa_stream*)((deviceType == ma_device_type_capture) ? pDevice->pulse.pStreamCapture : pDevice->pulse.pStreamPlayback);
    MA_ASSERT(pStream != NULL);

    pOP = ((ma_pa_stream_cork_proc)pContext->pulse.pa_stream_cork)(pStream, cork, ma_pulse_operation_complete_callback, &wasSuccessful);
    if (pOP == NULL) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to cork PulseAudio stream.", (cork == 0) ? MA_FAILED_TO_START_BACKEND_DEVICE : MA_FAILED_TO_STOP_BACKEND_DEVICE);
    }

    result = ma_device__wait_for_operation__pulse(pDevice, pOP);
    ((ma_pa_operation_unref_proc)pContext->pulse.pa_operation_unref)(pOP);

    if (result != MA_SUCCESS) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] An error occurred while waiting for the PulseAudio stream to cork.", result);
    }

    if (!wasSuccessful) {
        if (cork) {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to stop PulseAudio stream.", MA_FAILED_TO_STOP_BACKEND_DEVICE);
        } else {
            return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[PulseAudio] Failed to start PulseAudio stream.", MA_FAILED_TO_START_BACKEND_DEVICE);
        }
    }

    return MA_SUCCESS;
}